

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log10.c
# Opt level: O3

double c_log10(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  int local_c;
  
  iVar4 = isnan(x);
  if (iVar4 == 0) {
    if ((INFINITY != x) || (NAN(INFINITY) || NAN(x))) {
      if (x <= 0.0) {
        if ((x != 0.0) || (NAN(x))) {
          mtherr(fname,1);
          x = NAN;
        }
        else {
          mtherr(fname,2);
          x = -INFINITY;
        }
      }
      else {
        dVar1 = frexp(x,&local_c);
        uVar5 = SUB84(dVar1,0);
        uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
        iVar4 = local_c;
        if (dVar1 < 0.7071067811865476) {
          iVar4 = local_c + -1;
          dVar1 = ldexp(dVar1,1);
          uVar5 = SUB84(dVar1,0);
          uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        dVar1 = (double)CONCAT44(uVar6,uVar5) + -1.0;
        dVar2 = polevl(dVar1,P,6);
        dVar3 = p1evl(dVar1,Q,6);
        dVar7 = ldexp(dVar1 * dVar1,-1);
        dVar7 = ((dVar2 * dVar1 * dVar1) / dVar3) * dVar1 - dVar7;
        x = (double)iVar4 * 0.30078125 +
            (double)iVar4 * 0.0002487456639811952 +
            dVar1 * 0.43359375 + dVar7 * 0.43359375 + (dVar1 + dVar7) * 0.0007007319032518276;
      }
    }
  }
  return x;
}

Assistant:

double c_log10(x)
double x;
{
VOLATILE double z;
double y;
#ifdef DEC
short *q;
#endif
int e;

#ifdef NANS
if( isnan(x) )
	return(x);
#endif
#ifdef INFINITIES
if( x == INFINITY )
	return(x);
#endif
/* Test for domain */
if( x <= 0.0 )
	{
	if( x == 0.0 )
	        {
		mtherr( fname, SING );
		return( -INFINITY );
	        }
	else
	        {
		mtherr( fname, DOMAIN );
		return( NAN );
	        }
	}

/* separate mantissa from exponent */

#ifdef DEC
q = (short *)&x;
e = *q;			/* short containing exponent */
e = ((e >> 7) & 0377) - 0200;	/* the exponent */
*q &= 0177;	/* strip exponent from x */
*q |= 040000;	/* x now between 0.5 and 1 */
#endif

#ifdef IBMPC
x = frexp( x, &e );
/*
q = (short *)&x;
q += 3;
e = *q;
e = ((e >> 4) & 0x0fff) - 0x3fe;
*q &= 0x0f;
*q |= 0x3fe0;
*/
#endif

/* Equivalent C language standard library function: */
#ifdef UNK
x = frexp( x, &e );
#endif

#ifdef MIEEE
x = frexp( x, &e );
#endif

/* logarithm using log(1+x) = x - .5x**2 + x**3 P(x)/Q(x) */

if( x < SQRTH )
	{
	e -= 1;
	x = ldexp( x, 1 ) - 1.0; /*  2x - 1  */
	}	
else
	{
	x = x - 1.0;
	}


/* rational form */
z = x*x;
y = x * ( z * polevl( x, P, 6 ) / p1evl( x, Q, 6 ) );
y = y - ldexp( z, -1 );   /*  y - 0.5 * x**2  */

/* multiply log of fraction by log10(e)
 * and base 2 exponent by log10(2)
 */
z = (x + y) * L10EB;  /* accumulate terms in order of size */
z += y * L10EA;
z += x * L10EA;
z += e * L102B;
z += e * L102A;


return( z );
}